

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O0

void __thiscall
bdQuery::bdQuery(bdQuery *this,bdNodeId *id,list<bdId,_std::allocator<bdId>_> *startList,
                uint32_t queryFlags,bdDhtFunctions *fns)

{
  bool bVar1;
  uint uVar2;
  reference pbVar3;
  pair<bdMetric,_bdPeer> local_118;
  undefined1 local_b8 [8];
  bdMetric dist;
  undefined1 auStack_98 [8];
  bdPeer peer;
  _List_iterator<bdId> local_40;
  iterator it;
  time_t now;
  bdDhtFunctions *fns_local;
  uint32_t queryFlags_local;
  list<bdId,_std::allocator<bdId>_> *startList_local;
  bdNodeId *id_local;
  bdQuery *this_local;
  
  std::
  multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
  ::multimap(&this->mClosest);
  std::
  multimap<bdMetric,_bdPeer,_std::less<bdMetric>,_std::allocator<std::pair<const_bdMetric,_bdPeer>_>_>
  ::multimap(&this->mPotentialPeers);
  std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::list(&this->mProxiesUnknown);
  std::__cxx11::list<bdPeer,_std::allocator<bdPeer>_>::list(&this->mProxiesFlagged);
  *(undefined8 *)(this->mId).data = *(undefined8 *)id->data;
  *(undefined8 *)((this->mId).data + 8) = *(undefined8 *)(id->data + 8);
  *(undefined4 *)((this->mId).data + 0x10) = *(undefined4 *)(id->data + 0x10);
  this->mFns = fns;
  it._M_node = (_List_node_base *)time((time_t *)0x0);
  std::_List_iterator<bdId>::_List_iterator(&local_40);
  local_40._M_node =
       (_List_node_base *)std::__cxx11::list<bdId,_std::allocator<bdId>_>::begin(startList);
  while( true ) {
    peer._64_8_ = std::__cxx11::list<bdId,_std::allocator<bdId>_>::end(startList);
    bVar1 = std::operator!=(&local_40,(_Self *)&peer.mExtraFlags);
    if (!bVar1) break;
    bdPeer::bdPeer((bdPeer *)auStack_98);
    peer.mPeerId.id.data[0x10] = '\0';
    peer.mPeerId.id.data[0x11] = '\0';
    peer.mPeerId.id.data[0x12] = '\0';
    peer.mPeerId.id.data[0x13] = '\0';
    peer.mPeerFlags = 0;
    peer.mLastSendTime = 0;
    peer.mPeerId.id.data[0xc] = '\0';
    peer.mPeerId.id.data[0xd] = '\0';
    peer.mPeerId.id.data[0xe] = '\0';
    peer.mPeerId.id.data[0xf] = '\0';
    peer.mLastRecvTime = (time_t)it._M_node;
    pbVar3 = std::_List_iterator<bdId>::operator*(&local_40);
    peer.mPeerId.id.data._8_4_ = *(undefined4 *)((pbVar3->id).data + 0x10);
    auStack_98._0_2_ = (pbVar3->addr).sin_family;
    auStack_98._2_2_ = (pbVar3->addr).sin_port;
    auStack_98._4_4_ = (pbVar3->addr).sin_addr.s_addr;
    peer.mPeerId.addr._0_4_ = *(undefined4 *)(pbVar3->addr).sin_zero;
    peer.mPeerId.addr.sin_addr.s_addr = *(in_addr_t *)((pbVar3->addr).sin_zero + 4);
    peer.mPeerId.addr.sin_zero._0_4_ = *(undefined4 *)(pbVar3->id).data;
    peer.mPeerId.addr.sin_zero._4_4_ = *(undefined4 *)((pbVar3->id).data + 4);
    peer.mPeerId.id.data._0_4_ = *(undefined4 *)((pbVar3->id).data + 8);
    peer.mPeerId.id.data._4_4_ = *(undefined4 *)((pbVar3->id).data + 0xc);
    (*this->mFns->_vptr_bdDhtFunctions[4])(this->mFns,this,peer.mPeerId.addr.sin_zero,local_b8);
    std::pair<bdMetric,_bdPeer>::pair<bdMetric_&,_bdPeer_&,_true>
              (&local_118,(bdMetric *)local_b8,(bdPeer *)auStack_98);
    std::
    multimap<bdMetric,bdPeer,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>::
    insert<std::pair<bdMetric,bdPeer>>
              ((multimap<bdMetric,bdPeer,std::less<bdMetric>,std::allocator<std::pair<bdMetric_const,bdPeer>>>
                *)&this->mClosest,&local_118);
    std::_List_iterator<bdId>::operator++(&local_40,0);
  }
  this->mState = 2;
  this->mQueryFlags = queryFlags;
  this->mQueryTS = (time_t)it._M_node;
  this->mSearchTime = 0;
  uVar2 = (*this->mFns->_vptr_bdDhtFunctions[2])();
  this->mClosestListSize = (int)((double)(uVar2 & 0xffff) * 1.5);
  this->mPotPeerCleanTS = (time_t)it._M_node;
  this->mQueryIdlePeerRetryPeriod = 600;
  this->mRequiredPeerFlags = 0x200;
  bdZeroNodeId(&(this->mLimit).super_bdNodeId);
  return;
}

Assistant:

bdQuery::bdQuery(const bdNodeId *id, std::list<bdId> &startList, uint32_t queryFlags, 
		bdDhtFunctions *fns) {
	/* */
	mId = *id;
	mFns = fns;

	time_t now = time(NULL);
	std::list<bdId>::iterator it;
	for (it = startList.begin(); it != startList.end(); it++) {
		bdPeer peer;
		peer.mLastSendTime = 0;
		peer.mLastRecvTime = 0;
		peer.mPeerFlags = 0;
		peer.mFoundTime = now;
		peer.mPeerId = *it;

		bdMetric dist;

		mFns->bdDistance(&mId, &(peer.mPeerId.id), &dist);

		mClosest.insert(std::pair<bdMetric, bdPeer>(dist, peer));


	}

	mState = BITDHT_QUERY_QUERYING;
	mQueryFlags = queryFlags;
	mQueryTS = now;
	mSearchTime = 0;
	mClosestListSize = (int) (1.5 * mFns->bdNumQueryNodes());
	mPotPeerCleanTS = now;

	mQueryIdlePeerRetryPeriod = QUERY_IDLE_RETRY_PEER_PERIOD;
	mRequiredPeerFlags = BITDHT_PEER_STATUS_DHT_ENGINE_VERSION; // XXX to update later.

	/* setup the limit of the search
	 * by default it is setup to 000000 = exact match
	 */
	bdZeroNodeId(&mLimit);
}